

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O3

XProtoType * __thiscall xercesc_4_0::XercesXPath::getProtoType(XercesXPath *this)

{
  return (XProtoType *)classXercesXPath;
}

Assistant:

void XercesXPath::serialize(XSerializeEngine& serEng)
{

    if (serEng.isStoring())
    {
        serEng<<fEmptyNamespaceId;
        serEng.writeString(fExpression);

        /***
         * Serialize RefVectorOf<XercesLocationPath>* fLocationPaths;
         ***/
        XTemplateSerializer::storeObject(fLocationPaths, serEng);
    }
    else
    {
        serEng>>fEmptyNamespaceId;
        serEng.readString(fExpression);

        /***
         * Deserialize RefVectorOf<XercesLocationPath>* fLocationPaths;
         ***/
        XTemplateSerializer::loadObject(&fLocationPaths, 8, true, serEng);
    }
}